

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

green_poller_t green_poller_init(green_loop_t_conflict loop,size_t size)

{
  green_poller_t pgVar1;
  green_future_t *ppgVar2;
  
  if (size == 0 || loop == (green_loop_t_conflict)0x0) {
    pgVar1 = (green_poller_t)0x0;
  }
  else {
    if (loop->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","loop->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x17c);
      fflush(_stderr);
      abort();
    }
    pgVar1 = (green_poller_t)green_malloc(0x30);
    pgVar1->loop = loop;
    pgVar1->refs = 1;
    ppgVar2 = (green_future_t *)green_malloc((int)size * 8);
    pgVar1->futures = ppgVar2;
    pgVar1->size = size;
  }
  return pgVar1;
}

Assistant:

green_poller_t green_poller_init(green_loop_t loop, size_t size)
{
    if ((loop == NULL) || (size == 0)) {
        return NULL;
    }
    green_assert(loop->refs > 0);

    green_poller_t poller = green_malloc(sizeof(struct green_poller));
    poller->loop = loop;
    poller->refs = 1;
    poller->futures = green_malloc(size * sizeof(green_future_t));
    poller->size = size;

    return poller;
}